

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setCursor(QWidget *this,QCursor *cursor)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  QWExtra *pQVar2;
  int iVar3;
  QCursor *this_01;
  pointer __p;
  long in_FS_OFFSET;
  _Head_base<0UL,_QCursor_*,_false> local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  iVar3 = QCursor::shape();
  if ((iVar3 != 0) ||
     ((pQVar2 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar2 != (QWExtra *)0x0 &&
      ((_Head_base<0UL,_QCursor_*,_false>)
       *(_Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_> *)
        &(pQVar2->curs)._M_t.super___uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> !=
       (QCursor *)0x0)))) {
    QWidgetPrivate::createExtra(this_00);
    this_01 = (QCursor *)operator_new(8);
    QCursor::QCursor(this_01,cursor);
    local_38._M_head_impl = (QCursor *)0x0;
    std::__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_>::reset
              ((__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> *)
               &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->curs,this_01);
    std::unique_ptr<QCursor,_std::default_delete<QCursor>_>::~unique_ptr
              ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)&local_38);
  }
  uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
  if ((uVar1 & 0x40) == 0) {
    *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar1 | 0x40;
  }
  qt_qpa_set_cursor(*(QWidget **)&this_00->field_0x8,false);
  local_38._M_head_impl = (QCursor *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,CursorChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setCursor(const QCursor &cursor)
{
    Q_D(QWidget);
    if (cursor.shape() != Qt::ArrowCursor
        || (d->extra && d->extra->curs))
    {
        d->createExtra();
        d->extra->curs = std::make_unique<QCursor>(cursor);
    }
    setAttribute(Qt::WA_SetCursor);
    d->setCursor_sys(cursor);

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}